

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int tcptran_ep_bind(void *arg,nng_url *url)

{
  int iVar1;
  uint32_t local_2c [2];
  int port;
  
  nni_mtx_lock((nni_mtx *)arg);
  iVar1 = nng_stream_listener_listen(*(nng_stream_listener **)((long)arg + 0x418));
  if (iVar1 == 0) {
    nng_stream_listener_get_int
              (*(nng_stream_listener **)((long)arg + 0x418),"tcp-bound-port",(int *)local_2c);
    url->u_port = local_2c[0];
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return iVar1;
}

Assistant:

static int
tcptran_ep_bind(void *arg, nng_url *url)
{
	tcptran_ep *ep = arg;
	int         rv;

	nni_mtx_lock(&ep->mtx);
	rv = nng_stream_listener_listen(ep->listener);
	if (rv == 0) {
		int port;
		nng_stream_listener_get_int(
		    ep->listener, NNG_OPT_TCP_BOUND_PORT, &port);
		url->u_port = (uint32_t) port;
	}
	nni_mtx_unlock(&ep->mtx);

	return (rv);
}